

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_feedback_ctl_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_ctl_data_t *_aux)

{
  uint uVar1;
  uint uVar2;
  long in_RDX;
  char in_SIL;
  long *in_RDI;
  long in_FS_OFFSET;
  char *xcb_tmp;
  uint i;
  uint xcb_block_len;
  uint xcb_parts_idx;
  uint xcb_pad;
  uint xcb_padding_offset;
  uint xcb_align_to;
  uint xcb_buffer_len;
  char *xcb_out;
  char xcb_pad0 [3];
  iovec xcb_parts [24];
  void *local_1d8;
  uint local_1cc;
  int local_1c8;
  uint local_1c4;
  int local_1b8;
  int local_1b4;
  void *local_1b0;
  undefined1 local_18b [3];
  ulong local_188 [49];
  
  local_188[0x30] = *(long *)(in_FS_OFFSET + 0x28);
  local_1b0 = (void *)*in_RDI;
  local_1b4 = 0;
  local_1b8 = 0;
  memset(local_18b,0,3);
  memset(local_188,0xaa,0x180);
  local_1c4 = 0;
  local_1c8 = 0;
  if (in_SIL == '\0') {
    local_188[1] = 1;
    local_188[2] = in_RDX + 1;
    local_188[3] = 1;
    local_188[4] = in_RDX + 2;
    local_188[5] = 1;
    local_188[6] = in_RDX + 3;
    local_188[7] = 1;
    local_188[8] = in_RDX + 4;
    local_188[9] = 2;
    local_188[10] = in_RDX + 6;
    local_188[0xb] = 2;
    local_188[0xc] = in_RDX + 8;
    local_188[0xd] = 4;
    local_188[0xe] = in_RDX + 0xc;
    local_1c8 = 0x10;
    local_188[0xf] = 4;
    local_1c4 = 8;
    local_1b8 = 4;
  }
  if (in_SIL == '\x01') {
    local_188[(ulong)local_1c4 * 2] = (ulong)local_18b;
    local_188[(ulong)local_1c4 * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 1) * 2] = in_RDX + 0x12;
    local_188[(ulong)(local_1c4 + 1) * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 2) * 2] = in_RDX + 0x14;
    local_188[(ulong)(local_1c4 + 2) * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 3) * 2] = in_RDX + 0x16;
    local_1c8 = local_1c8 + 8;
    local_188[(ulong)(local_1c4 + 3) * 2 + 1] = 2;
    local_1c4 = local_1c4 + 4;
    local_1b8 = 2;
  }
  if (in_SIL == '\x02') {
    local_188[(ulong)local_1c4 * 2] = (ulong)local_18b;
    local_188[(ulong)local_1c4 * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 1) * 2] = in_RDX + 0x1a;
    local_1b4 = local_1c8 + 4;
    local_188[(ulong)(local_1c4 + 1) * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 2) * 2] = *(ulong *)(in_RDX + 0x20);
    local_1c8 = (uint)*(ushort *)(in_RDX + 0x1a) * 4;
    local_188[(ulong)(local_1c4 + 2) * 2 + 1] = (ulong)*(ushort *)(in_RDX + 0x1a) << 2;
    local_1c4 = local_1c4 + 3;
    local_1b8 = 4;
  }
  if (in_SIL == '\x03') {
    local_188[(ulong)local_1c4 * 2] = in_RDX + 0x28;
    local_1c8 = local_1c8 + 4;
    local_188[(ulong)local_1c4 * 2 + 1] = 4;
    local_1c4 = local_1c4 + 1;
    local_1b8 = 4;
  }
  if (in_SIL == '\x04') {
    local_188[(ulong)local_1c4 * 2] = in_RDX + 0x2c;
    local_188[(ulong)local_1c4 * 2 + 1] = 4;
    local_188[(ulong)(local_1c4 + 1) * 2] = in_RDX + 0x30;
    local_1c8 = local_1c8 + 8;
    local_188[(ulong)(local_1c4 + 1) * 2 + 1] = 4;
    local_1c4 = local_1c4 + 2;
    local_1b8 = 4;
  }
  if (in_SIL == '\x05') {
    local_188[(ulong)local_1c4 * 2] = in_RDX + 0x34;
    local_188[(ulong)local_1c4 * 2 + 1] = 1;
    local_188[(ulong)(local_1c4 + 1) * 2] = (ulong)local_18b;
    local_188[(ulong)(local_1c4 + 1) * 2 + 1] = 3;
    local_188[(ulong)(local_1c4 + 2) * 2] = in_RDX + 0x38;
    local_188[(ulong)(local_1c4 + 2) * 2 + 1] = 2;
    local_188[(ulong)(local_1c4 + 3) * 2] = in_RDX + 0x3a;
    local_1c8 = local_1c8 + 8;
    local_188[(ulong)(local_1c4 + 3) * 2 + 1] = 2;
    local_1c4 = local_1c4 + 4;
    local_1b8 = 2;
  }
  uVar1 = -local_1c8 & local_1b8 - 1U;
  uVar2 = local_1c8 + uVar1 + local_1b4;
  if (uVar1 != 0) {
    local_188[(ulong)local_1c4 * 2] = (ulong)local_18b;
    local_188[(ulong)local_1c4 * 2 + 1] = (ulong)uVar1;
    local_1c4 = local_1c4 + 1;
  }
  if (local_1b0 == (void *)0x0) {
    local_1b0 = malloc((ulong)uVar2);
    *in_RDI = (long)local_1b0;
  }
  local_1d8 = local_1b0;
  for (local_1cc = 0; local_1cc < local_1c4; local_1cc = local_1cc + 1) {
    if ((local_188[(ulong)local_1cc * 2] != 0) && (local_188[(ulong)local_1cc * 2 + 1] != 0)) {
      memcpy(local_1d8,(void *)local_188[(ulong)local_1cc * 2],local_188[(ulong)local_1cc * 2 + 1]);
    }
    if (local_188[(ulong)local_1cc * 2 + 1] != 0) {
      local_1d8 = (void *)(local_188[(ulong)local_1cc * 2 + 1] + (long)local_1d8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_188[0x30]) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

int
xcb_input_feedback_ctl_data_serialize (void                                **_buffer,
                                       uint8_t                               class_id,
                                       const xcb_input_feedback_ctl_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[24];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_ctl_data_t.keyboard.key */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key;
        xcb_block_len += sizeof(xcb_input_key_code_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_key_code_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_key_code_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.auto_repeat_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.auto_repeat_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.key_click_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key_click_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_ctl_data_t.pointer.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.pointer.num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.num;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.denom;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_ctl_data_t.string.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_ctl_data_t.integer.int_to_display */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.int_to_display;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_ctl_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_ctl_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}